

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

void __thiscall
BCLog::Logger::FormatLogStrInPlace
          (Logger *this,string *str,LogFlags category,Level level,string_view source_file,
          int source_line,string_view logging_function,string_view threadname,time_point now,
          seconds mocktime)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider args;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  basic_string_view<char,_std::char_traits<char>_> *args_2;
  ulong uVar3;
  long in_FS_OFFSET;
  ulong local_68;
  basic_string_view<char,_std::char_traits<char>_> *pbStack_60;
  string local_50;
  long local_30;
  
  pbVar2 = (basic_string_view<char,_std::char_traits<char>_> *)source_file._M_str;
  uVar3 = source_file._M_len;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  args_2 = pbVar2;
  GetLogPrefix_abi_cxx11_(&local_50,this,category,level);
  args._M_p = local_50._M_dataplus._M_p;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
            (str,0,0,local_50._M_dataplus._M_p,local_50._M_string_length);
  paVar1 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (this->m_log_sourcelocations == true) {
    if ((1 < uVar3) && ((short)pbVar2->_M_len == 0x2f2e)) {
      uVar3 = uVar3 - 2;
      pbVar2 = (basic_string_view<char,_std::char_traits<char>_> *)((long)&pbVar2->_M_len + 2);
    }
    local_68 = uVar3;
    pbStack_60 = pbVar2;
    tinyformat::
    format<std::basic_string_view<char,std::char_traits<char>>,int,std::basic_string_view<char,std::char_traits<char>>>
              (&local_50,(tinyformat *)"[%s:%d] [%s] ",(char *)&local_68,
               (basic_string_view<char,_std::char_traits<char>_> *)&source_line,
               (int *)&logging_function,args_2);
    args._M_p = local_50._M_dataplus._M_p;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              (str,0,0,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->m_log_threadnames == true) {
    if (threadname._M_len == 0) {
      local_68 = 7;
      pbStack_60 = (basic_string_view<char,_std::char_traits<char>_> *)0x269ebb;
    }
    else {
      local_68 = threadname._M_len;
      pbStack_60 = (basic_string_view<char,_std::char_traits<char>_> *)threadname._M_str;
    }
    tinyformat::format<std::basic_string_view<char,std::char_traits<char>>>
              (&local_50,(tinyformat *)0x27cf80,(char *)&local_68,
               (basic_string_view<char,_std::char_traits<char>_> *)args._M_p);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              (str,0,0,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  LogTimestampStr_abi_cxx11_(&local_50,this,now,mocktime);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
            (str,0,0,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BCLog::Logger::FormatLogStrInPlace(std::string& str, BCLog::LogFlags category, BCLog::Level level, std::string_view source_file, int source_line, std::string_view logging_function, std::string_view threadname, SystemClock::time_point now, std::chrono::seconds mocktime) const
{
    str.insert(0, GetLogPrefix(category, level));

    if (m_log_sourcelocations) {
        str.insert(0, strprintf("[%s:%d] [%s] ", RemovePrefixView(source_file, "./"), source_line, logging_function));
    }

    if (m_log_threadnames) {
        str.insert(0, strprintf("[%s] ", (threadname.empty() ? "unknown" : threadname)));
    }

    str.insert(0, LogTimestampStr(now, mocktime));
}